

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_id_getter.cpp
# Opt level: O3

void __thiscall SharedIdGetter::SharedIdGetter(SharedIdGetter *this,uid_t start,uid_t count)

{
  long lVar1;
  undefined1 auVar2 [16];
  SharedMemoryArray<unsigned_int> *this_00;
  SharedMemoryObject<unsigned_long> *this_01;
  pointer __p;
  int iVar3;
  ulong uVar4;
  ulong size;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  __uniq_ptr_impl<SharedMemoryArray<unsigned_int>,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
  local_38;
  long lVar7;
  
  this->ids_stack_ =
       (__uniq_ptr_data<SharedMemoryArray<unsigned_int>,_std::default_delete<SharedMemoryArray<unsigned_int>_>,_true,_true>
        )0x0;
  this->stack_head_ =
       (__uniq_ptr_data<SharedMemoryObject<unsigned_long>,_std::default_delete<SharedMemoryObject<unsigned_long>_>,_true,_true>
        )0x0;
  SharedMutex::SharedMutex(&this->mutex_);
  this_00 = (SharedMemoryArray<unsigned_int> *)operator_new(0x10);
  size = (ulong)count;
  SharedMemoryArray<unsigned_int>::SharedMemoryArray(this_00,size);
  local_38._M_t.
  super__Tuple_impl<0UL,_SharedMemoryArray<unsigned_int>_*,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
  .super__Head_base<0UL,_SharedMemoryArray<unsigned_int>_*,_false>._M_head_impl =
       (tuple<SharedMemoryArray<unsigned_int>_*,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
        )(_Tuple_impl<0UL,_SharedMemoryArray<unsigned_int>_*,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
          )0x0;
  std::
  __uniq_ptr_impl<SharedMemoryArray<unsigned_int>,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
  ::reset((__uniq_ptr_impl<SharedMemoryArray<unsigned_int>,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
           *)this,this_00);
  std::
  unique_ptr<SharedMemoryArray<unsigned_int>,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
  ::~unique_ptr((unique_ptr<SharedMemoryArray<unsigned_int>,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
                 *)&local_38);
  this_01 = (SharedMemoryObject<unsigned_long> *)operator_new(8);
  SharedMemoryObject<unsigned_long>::SharedMemoryObject<>(this_01);
  local_38._M_t.
  super__Tuple_impl<0UL,_SharedMemoryArray<unsigned_int>_*,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
  .super__Head_base<0UL,_SharedMemoryArray<unsigned_int>_*,_false>._M_head_impl =
       (tuple<SharedMemoryArray<unsigned_int>_*,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
        )(_Tuple_impl<0UL,_SharedMemoryArray<unsigned_int>_*,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
          )0x0;
  std::
  __uniq_ptr_impl<SharedMemoryObject<unsigned_long>,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
  ::reset((__uniq_ptr_impl<SharedMemoryObject<unsigned_long>,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
           *)&this->stack_head_,this_01);
  std::
  unique_ptr<SharedMemoryObject<unsigned_long>,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
  ::~unique_ptr((unique_ptr<SharedMemoryObject<unsigned_long>,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
                 *)&local_38);
  auVar2 = _DAT_00134710;
  if (count != 0) {
    lVar1 = (long)((this->ids_stack_)._M_t.
                   super___uniq_ptr_impl<SharedMemoryArray<unsigned_int>,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_SharedMemoryArray<unsigned_int>_*,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
                   .super__Head_base<0UL,_SharedMemoryArray<unsigned_int>_*,_false>._M_head_impl)->
                  ptr_;
    lVar7 = size - 1;
    auVar5._8_4_ = (int)lVar7;
    auVar5._0_8_ = lVar7;
    auVar5._12_4_ = (int)((ulong)lVar7 >> 0x20);
    iVar3 = (count - 1) + start;
    uVar4 = 0;
    auVar5 = auVar5 ^ _DAT_00134710;
    auVar6 = _DAT_00134700;
    do {
      auVar8 = auVar6 ^ auVar2;
      if ((bool)(~(auVar8._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar8._0_4_ ||
                  auVar5._4_4_ < auVar8._4_4_) & 1)) {
        *(int *)(lVar1 + uVar4 * 4) = iVar3;
      }
      if ((auVar8._12_4_ != auVar5._12_4_ || auVar8._8_4_ <= auVar5._8_4_) &&
          auVar8._12_4_ <= auVar5._12_4_) {
        *(uint *)(lVar1 + 4 + uVar4 * 4) = ((uint)uVar4 ^ 0xfffffffe) + count + start;
      }
      uVar4 = uVar4 + 2;
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar7 + 2;
      iVar3 = iVar3 + -2;
    } while ((size + 1 & 0xfffffffffffffffe) != uVar4);
  }
  *((this->stack_head_)._M_t.
    super___uniq_ptr_impl<SharedMemoryObject<unsigned_long>,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_SharedMemoryObject<unsigned_long>_*,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
    .super__Head_base<0UL,_SharedMemoryObject<unsigned_long>_*,_false>._M_head_impl)->ptr_ = size;
  return;
}

Assistant:

SharedIdGetter::SharedIdGetter(uid_t start, uid_t count) {
    ids_stack_ = std::make_unique<SharedMemoryArray<uid_t>>(count);
    stack_head_ = std::make_unique<SharedMemoryObject<size_t>>();
    for (size_t i = 0; i < count; ++i) {
        (*ids_stack_)[i] = start + count - 1 - i; // Lower the ID is, closer to stack head it is
    }
    (*stack_head_->get()) = count;
}